

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bool __thiscall lzham::lzcompressor::send_zlib_header(lzcompressor *this)

{
  long lVar1;
  bool bVar2;
  vector<unsigned_char> *in_RDI;
  uint i;
  uint dict_adler32;
  int check;
  int flg;
  int cmf;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  uint local_28;
  bool local_1;
  
  if (((ulong)in_RDI[2].m_p & 0x20) == 0) {
    local_1 = true;
  }
  else {
    uVar3 = in_RDI[1].m_capacity;
    bVar2 = vector<unsigned_char>::try_push_back
                      (in_RDI,(uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = vector<unsigned_char>::try_push_back
                        (in_RDI,(uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        lVar1._0_4_ = in_RDI[2].m_size;
        lVar1._4_4_ = in_RDI[2].m_capacity;
        if (lVar1 != 0) {
          lzham::adler32(*(void **)&in_RDI[2].m_size,(ulong)*(uint *)&in_RDI[2].m_malloc_context,1);
          for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
            bVar2 = vector<unsigned_char>::try_push_back
                              (in_RDI,(uchar *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              return false;
            }
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool lzcompressor::send_zlib_header()
   {
      if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_WRITE_ZLIB_STREAM) == 0)
         return true;

      // set CM (method) and CINFO (dictionary size) fields
      int cmf = LZHAM_Z_LZHAM | ((m_params.m_dict_size_log2 - 15) << 4);

      // set FLEVEL by mapping LZHAM's compression level to zlib's
      int flg = 0;
      switch (m_params.m_compression_level)
      {
         case LZHAM_COMP_LEVEL_FASTEST:
         {
            flg = 0 << 6;
            break;
         }
         case LZHAM_COMP_LEVEL_FASTER:
         {
            flg = 1 << 6;
            break;
         }
         case LZHAM_COMP_LEVEL_DEFAULT:
         case LZHAM_COMP_LEVEL_BETTER:
         {
            flg = 2 << 6;
            break;
         }
         default:
         {
            flg = 3 << 6;
            break;
         }
      }

      // set FDICT flag
      if (m_params.m_pSeed_bytes)
         flg |= 32;

      int check = ((cmf << 8) + flg) % 31;
      if (check)
         flg += (31 - check);

      LZHAM_ASSERT(0 == (((cmf << 8) + flg) % 31));
      if (!m_comp_buf.try_push_back(static_cast<uint8>(cmf)))
         return false;
      if (!m_comp_buf.try_push_back(static_cast<uint8>(flg)))
         return false;

      if (m_params.m_pSeed_bytes)
      {
         // send adler32 of DICT
         uint dict_adler32 = adler32(m_params.m_pSeed_bytes, m_params.m_num_seed_bytes);
         for (uint i = 0; i < 4; i++)
         {
            if (!m_comp_buf.try_push_back(static_cast<uint8>(dict_adler32 >> 24)))
               return false;
            dict_adler32 <<= 8;
         }
      }

      return true;
   }